

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandDropSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *vCexes;
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  char *pcVar5;
  uint fVerbose;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"svh"), iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x73) {
      Abc_Print(-2,"usage: dropsat [-sh]\n");
      Abc_Print(-2,"\t         replaces satisfiable POs by constant 0 and cleans up the AIG\n");
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggles skipping sequential sweep [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar2 = -2;
LAB_002583c8:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    pcVar4 = "Empty network.\n";
  }
  else if (pAVar3->ntkType == ABC_NTK_STRASH) {
    vCexes = pAbc->vCexVec;
    if (vCexes != (Vec_Ptr_t *)0x0) {
      if (vCexes->nSize != pAVar3->vPos->nSize) {
        Abc_Print(-1,"CEX array size (%d) does not match the number of outputs (%d).\n");
        return 1;
      }
      Abc_NtkDropSatOutputs(pAVar3,vCexes,fVerbose);
      if (!bVar1) {
        pAVar3 = Abc_NtkDarLatchSweep(pAVar3,1,1,1,0,-1,-1,0,0);
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Removing SAT outputs has failed.\n");
          return 1;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
        return 0;
      }
      return 0;
    }
    pcVar4 = "CEX array is not defined. Run \"bmc3 -az\", \"sim3 -az\", or \"pdr -az\".\n";
  }
  else {
    pcVar4 = "This command works only for AIGs (run \"strash\").\n";
  }
  iVar2 = -1;
  goto LAB_002583c8;
}

Assistant:

int Abc_CommandDropSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkRes = NULL;
    int fNoSweep = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fNoSweep ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    if ( pAbc->vCexVec == NULL )
    {
        Abc_Print( -1, "CEX array is not defined. Run \"bmc3 -az\", \"sim3 -az\", or \"pdr -az\".\n" );
        return 1;
    }
    if ( Vec_PtrSize(pAbc->vCexVec) != Abc_NtkPoNum(pNtk) )
    {
        Abc_Print( -1, "CEX array size (%d) does not match the number of outputs (%d).\n", Vec_PtrSize(pAbc->vCexVec), Abc_NtkPoNum(pNtk) );
        return 1;
    }
    Abc_NtkDropSatOutputs( pNtk, pAbc->vCexVec, fVerbose );
    if ( !fNoSweep )
    {
        pNtkRes = Abc_NtkDarLatchSweep( pNtk, 1, 1, 1, 0, -1, -1, 0, 0 );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Removing SAT outputs has failed.\n" );
            return 1;
        }
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dropsat [-sh]\n" );
    Abc_Print( -2, "\t         replaces satisfiable POs by constant 0 and cleans up the AIG\n" );
    Abc_Print( -2, "\t-s     : toggles skipping sequential sweep [default = %s]\n", fNoSweep? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}